

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O0

aom_image_t * aom_codec_get_frame(aom_codec_ctx_t *ctx,aom_codec_iter_t *iter)

{
  aom_codec_get_frame_fn_t_conflict p_Var1;
  aom_codec_alg_priv_t_conflict *paVar2;
  aom_codec_iter_t *in_RSI;
  aom_codec_ctx_t *in_RDI;
  aom_image_t *img;
  aom_image_t *local_18;
  
  if ((((in_RDI == (aom_codec_ctx_t *)0x0) || (in_RSI == (aom_codec_iter_t *)0x0)) ||
      (in_RDI->iface == (aom_codec_iface_t *)0x0)) || (in_RDI->priv == (aom_codec_priv_t *)0x0)) {
    local_18 = (aom_image_t *)0x0;
  }
  else {
    p_Var1 = (in_RDI->iface->dec).get_frame;
    paVar2 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
    local_18 = (*p_Var1)(paVar2,in_RSI);
  }
  return local_18;
}

Assistant:

aom_image_t *aom_codec_get_frame(aom_codec_ctx_t *ctx, aom_codec_iter_t *iter) {
  aom_image_t *img;

  if (!ctx || !iter || !ctx->iface || !ctx->priv)
    img = NULL;
  else
    img = ctx->iface->dec.get_frame(get_alg_priv(ctx), iter);

  return img;
}